

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextEllipsis
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,float clip_max_x,
               float ellipsis_max_x,char *text,char *text_end_full,ImVec2 *text_size_if_known)

{
  float size;
  ImWchar IVar1;
  ImFont *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char *text_end;
  ImDrawList *draw_list_00;
  char *in_text;
  ImWchar c;
  int iVar5;
  ImU32 col;
  ImFontGlyph *pIVar6;
  int iVar7;
  ImGuiContext *g;
  ImGuiContext *pIVar8;
  char *text_display_end;
  uint uVar9;
  ImVec2 IVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  float fVar13;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float local_bc;
  char *text_end_ellipsis;
  float local_ac;
  ImVec2 local_a8;
  float local_a0;
  uint local_9c;
  ImVec2 local_98;
  undefined8 uStack_90;
  uint unused;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  ImDrawList *local_78;
  ImVec2 *local_70;
  char *local_68;
  ImFont *local_60;
  undefined1 local_58 [16];
  ImGuiContext *local_40;
  ImVec2 local_38;
  undefined8 extraout_XMM0_Qb;
  
  pIVar8 = GImGui;
  local_58._4_4_ = in_XMM1_Db;
  local_58._0_4_ = ellipsis_max_x;
  local_58._8_4_ = in_XMM1_Dc;
  local_58._12_4_ = in_XMM1_Dd;
  if ((text_end_full == (char *)0x0) && (text_end_full = text, text != (char *)0xffffffffffffffff))
  {
    do {
      if (*text_end_full == '#') {
        if (text_end_full[1] == '#') goto LAB_0010be4e;
      }
      else if (*text_end_full == '\0') goto LAB_0010be4e;
      text_end_full = text_end_full + 1;
    } while (text_end_full != (char *)0xffffffffffffffff);
    text_end_full = (char *)0xffffffffffffffff;
  }
LAB_0010be4e:
  local_ac = clip_max_x;
  if (text_size_if_known == (ImVec2 *)0x0) {
    if (text_end_full == text) {
      local_a8 = (ImVec2)((ulong)(uint)GImGui->FontSize << 0x20);
    }
    else {
      auVar11._0_8_ =
           ImFont::CalcTextSizeA
                     (GImGui->Font,GImGui->FontSize,3.4028235e+38,0.0,text,text_end_full,
                      (char **)0x0);
      auVar11._8_8_ = extraout_XMM0_Qb;
      auVar12._4_12_ = auVar11._4_12_;
      auVar12._0_4_ = (float)(int)(auVar11._0_4_ + 0.99999);
      local_a8 = auVar12._0_8_;
    }
  }
  else {
    local_a8 = *text_size_if_known;
  }
  if (local_a8.x <= pos_max->x - pos_min->x) {
    fStack_84 = pos_max->y;
    unused = (uint)local_ac;
    text_end_ellipsis = (char *)0x0;
    RenderTextClippedEx(draw_list,pos_min,(ImVec2 *)&unused,text,text_end_full,&local_a8,
                        (ImVec2 *)&text_end_ellipsis,(ImRect *)0x0);
  }
  else {
    local_40 = pIVar8;
    pIVar2 = draw_list->_Data->Font;
    size = draw_list->_Data->FontSize;
    text_end_ellipsis = (char *)0x0;
    IVar1 = pIVar2->EllipsisChar;
    iVar7 = 1;
    c = IVar1;
    if (IVar1 == 0xffff) {
      c = pIVar2->DotChar;
      iVar7 = 3;
    }
    local_9c = (uint)c;
    local_78 = draw_list;
    local_70 = pos_max;
    local_68 = text;
    pIVar6 = ImFont::FindGlyph(pIVar2,c);
    in_text = local_68;
    local_a0 = pIVar6->X1;
    local_bc = local_a0;
    if (IVar1 == 0xffff) {
      fVar13 = local_78->_Data->FontSize / pIVar2->FontSize;
      local_bc = (local_a0 - pIVar6->X0) + fVar13;
      local_a0 = (float)iVar7 * local_bc - fVar13;
    }
    uVar9 = -(uint)((float)local_58._0_4_ <= local_70->x);
    fVar13 = ((float)(~uVar9 & local_58._0_4_ | (uint)local_70->x & uVar9) - local_a0) - pos_min->x;
    if (fVar13 <= 1.0) {
      fVar13 = 1.0;
    }
    local_98 = ImFont::CalcTextSizeA
                         (pIVar2,size,fVar13,0.0,local_68,text_end_full,&text_end_ellipsis);
    uStack_90 = extraout_XMM0_Qb_00;
    local_60 = pIVar2;
    if (text_end_ellipsis < text_end_full && text_end_ellipsis == in_text) {
      _unused = (ImVec2)((ulong)_unused & 0xffffffff00000000);
      iVar5 = ImTextCharFromUtf8(&unused,in_text,text_end_full);
      text_end_ellipsis = in_text + iVar5;
      local_98 = ImFont::CalcTextSizeA
                           (pIVar2,size,3.4028235e+38,0.0,in_text,text_end_ellipsis,(char **)0x0);
      uStack_90 = extraout_XMM0_Qb_01;
    }
    while ((draw_list_00 = local_78, text_end = text_end_ellipsis, in_text < text_end_ellipsis &&
           ((text_end_ellipsis[-1] == ' ' || (text_end_ellipsis[-1] == '\t'))))) {
      text_end_ellipsis = text_end_ellipsis + -1;
      IVar10 = ImFont::CalcTextSizeA
                         (local_60,size,3.4028235e+38,0.0,text_end_ellipsis,text_end,(char **)0x0);
      local_98.x = local_98.x - IVar10.x;
    }
    fStack_84 = local_70->y;
    unused = (uint)local_ac;
    local_38.x = 0.0;
    local_38.y = 0.0;
    RenderTextClippedEx(local_78,pos_min,(ImVec2 *)&unused,in_text,text_end_ellipsis,&local_a8,
                        &local_38,(ImRect *)0x0);
    pIVar2 = local_60;
    uVar9 = local_9c;
    fVar13 = local_98.x + pos_min->x;
    text = local_68;
    pIVar8 = local_40;
    if (local_a0 + fVar13 <= (float)local_58._0_4_) {
      do {
        local_98.x = fVar13;
        local_58 = ZEXT416((uint)pos_min->y);
        unused = (uint)(GImGui->Style).Colors[0].x;
        fStack_84 = (GImGui->Style).Colors[0].y;
        uVar3 = (GImGui->Style).Colors[0].z;
        uVar4 = (GImGui->Style).Colors[0].w;
        fStack_7c = (GImGui->Style).Alpha * (float)uVar4;
        fStack_80 = (float)uVar3;
        col = ColorConvertFloat4ToU32((ImVec4 *)&unused);
        IVar10.y = (float)local_58._0_4_;
        IVar10.x = local_98.x;
        ImFont::RenderChar(pIVar2,draw_list_00,size,IVar10,col,(ImWchar)uVar9);
        fVar13 = local_98.x + local_bc;
        iVar7 = iVar7 + -1;
        text = local_68;
        pIVar8 = local_40;
      } while (iVar7 != 0);
    }
  }
  if (pIVar8->LogEnabled == true) {
    LogRenderedText(pos_min,text,text_end_full);
  }
  return;
}

Assistant:

void ImGui::RenderTextEllipsis(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, float clip_max_x, float ellipsis_max_x, const char* text, const char* text_end_full, const ImVec2* text_size_if_known)
{
    ImGuiContext& g = *GImGui;
    if (text_end_full == NULL)
        text_end_full = FindRenderedTextEnd(text);
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_end_full, false, 0.0f);

    //draw_list->AddLine(ImVec2(pos_max.x, pos_min.y - 4), ImVec2(pos_max.x, pos_max.y + 4), IM_COL32(0, 0, 255, 255));
    //draw_list->AddLine(ImVec2(ellipsis_max_x, pos_min.y-2), ImVec2(ellipsis_max_x, pos_max.y+2), IM_COL32(0, 255, 0, 255));
    //draw_list->AddLine(ImVec2(clip_max_x, pos_min.y), ImVec2(clip_max_x, pos_max.y), IM_COL32(255, 0, 0, 255));
    // FIXME: We could technically remove (last_glyph->AdvanceX - last_glyph->X1) from text_size.x here and save a few pixels.
    if (text_size.x > pos_max.x - pos_min.x)
    {
        // Hello wo...
        // |       |   |
        // min   max   ellipsis_max
        //          <-> this is generally some padding value

        const ImFont* font = draw_list->_Data->Font;
        const float font_size = draw_list->_Data->FontSize;
        const char* text_end_ellipsis = NULL;

        ImWchar ellipsis_char = font->EllipsisChar;
        int ellipsis_char_count = 1;
        if (ellipsis_char == (ImWchar)-1)
        {
            ellipsis_char = font->DotChar;
            ellipsis_char_count = 3;
        }
        const ImFontGlyph* glyph = font->FindGlyph(ellipsis_char);

        float ellipsis_glyph_width = glyph->X1;                 // Width of the glyph with no padding on either side
        float ellipsis_total_width = ellipsis_glyph_width;      // Full width of entire ellipsis

        if (ellipsis_char_count > 1)
        {
            // Full ellipsis size without free spacing after it.
            const float spacing_between_dots = 1.0f * (draw_list->_Data->FontSize / font->FontSize);
            ellipsis_glyph_width = glyph->X1 - glyph->X0 + spacing_between_dots;
            ellipsis_total_width = ellipsis_glyph_width * (float)ellipsis_char_count - spacing_between_dots;
        }

        // We can now claim the space between pos_max.x and ellipsis_max.x
        const float text_avail_width = ImMax((ImMax(pos_max.x, ellipsis_max_x) - ellipsis_total_width) - pos_min.x, 1.0f);
        float text_size_clipped_x = font->CalcTextSizeA(font_size, text_avail_width, 0.0f, text, text_end_full, &text_end_ellipsis).x;
        if (text == text_end_ellipsis && text_end_ellipsis < text_end_full)
        {
            // Always display at least 1 character if there's no room for character + ellipsis
            text_end_ellipsis = text + ImTextCountUtf8BytesFromChar(text, text_end_full);
            text_size_clipped_x = font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text, text_end_ellipsis).x;
        }
        while (text_end_ellipsis > text && ImCharIsBlankA(text_end_ellipsis[-1]))
        {
            // Trim trailing space before ellipsis (FIXME: Supporting non-ascii blanks would be nice, for this we need a function to backtrack in UTF-8 text)
            text_end_ellipsis--;
            text_size_clipped_x -= font->CalcTextSizeA(font_size, FLT_MAX, 0.0f, text_end_ellipsis, text_end_ellipsis + 1).x; // Ascii blanks are always 1 byte
        }

        // Render text, render ellipsis
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_ellipsis, &text_size, ImVec2(0.0f, 0.0f));
        float ellipsis_x = pos_min.x + text_size_clipped_x;
        if (ellipsis_x + ellipsis_total_width <= ellipsis_max_x)
            for (int i = 0; i < ellipsis_char_count; i++)
            {
                font->RenderChar(draw_list, font_size, ImVec2(ellipsis_x, pos_min.y), GetColorU32(ImGuiCol_Text), ellipsis_char);
                ellipsis_x += ellipsis_glyph_width;
            }
    }
    else
    {
        RenderTextClippedEx(draw_list, pos_min, ImVec2(clip_max_x, pos_max.y), text, text_end_full, &text_size, ImVec2(0.0f, 0.0f));
    }

    if (g.LogEnabled)
        LogRenderedText(&pos_min, text, text_end_full);
}